

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

void * qmemrchr(void *s,int needle,size_t size)

{
  byte *pbVar1;
  uchar *n;
  uchar *b;
  size_t size_local;
  int needle_local;
  void *s_local;
  
  n = (uchar *)((long)s + size);
  do {
    pbVar1 = n + -1;
    if (n == (uchar *)s) {
      return (void *)0x0;
    }
    n = pbVar1;
  } while ((uint)*pbVar1 != (needle & 0xffU));
  return pbVar1;
}

Assistant:

const void *qmemrchr(const void *s, int needle, size_t size) noexcept
{
#if QT_CONFIG(memrchr)
    return memrchr(s, needle, size);
#endif
    auto b = static_cast<const uchar *>(s);
    const uchar *n = b + size;
    while (n-- != b) {
        if (*n == uchar(needle))
            return n;
    }
    return nullptr;
}